

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O1

void Qentem::Test::TestVariableUTag3(QTest *test)

{
  TagBit *pTVar1;
  char16_t *pcVar2;
  Array<Qentem::Tags::TagBit> tags_cache;
  StringStream<char16_t> ss;
  Value<char16_t> value;
  Array<Qentem::Tags::TagBit> local_98;
  StringStream<char16_t> local_88;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_78;
  undefined1 local_68;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_58;
  undefined8 local_48;
  char16_t *local_40;
  undefined4 local_38;
  
  local_88.storage_ = (char16_t *)0x0;
  local_88.length_ = 0;
  local_88.capacity_ = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_68 = 0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0}";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0}",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])0x139e80,0x159);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:a}";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:a}",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"{var:a}",0x15c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0[0]}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[0]}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_88,(char16_t (*) [11])L"{var:0[0]}",0x160);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:a[0]}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:a[0]}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_88,(char16_t (*) [11])L"{var:a[0]}",0x164);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0[a]}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[a]}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_88,(char16_t (*) [11])L"{var:0[a]}",0x168);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:a[abc]}";
  local_38 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:a[abc]}",0xc,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[13]>
            (test,&local_88,(char16_t (*) [13])L"{var:a[abc]}",0x16c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_58.array_,(StringStream<char16_t> *)&local_98,
             L"[[[]],{\"a\":[\"x\"],\"b\":{\"a\":\"X\"}}]",0x20);
  pTVar1 = local_98.storage_;
  if (local_98.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.storage_);
  }
  operator_delete(pTVar1);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0}";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0}",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])0x139e80,0x174);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0[0]}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[0]}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_88,(char16_t (*) [11])L"{var:0[0]}",0x178);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0[0][0]}";
  local_38 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[0][0]}",0xd,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[14]>
            (test,&local_88,(char16_t (*) [14])L"{var:0[0][0]}",0x17c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:1}";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1}",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"{var:1}",0x182);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:2}";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:2}",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])0x139982,0x186);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:1[a]}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1[a]}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_88,(char16_t (*) [11])L"{var:1[a]}",0x18a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:1[b]}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1[b]}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_88,(char16_t (*) [11])L"{var:1[b]}",0x18e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_58.array_,(StringStream<char16_t> *)&local_98,
             L"[\"A\", \"abc\", true, 456, 1.5]",0x1c);
  pTVar1 = local_98.storage_;
  if (local_98.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.storage_);
  }
  operator_delete(pTVar1);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0";
  local_38 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0",6,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])0x13a50c,0x196);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"var:0}";
  local_38 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:0}",6,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])0x139e82,0x19a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{v}";
  local_38 = 3;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v}",3,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"{v}",0x19e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{va}";
  local_38 = 4;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va}",4,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])L"{va}",0x1a2);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var}";
  local_38 = 5;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var}",5,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"{var}",0x1a6);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:}";
  local_38 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:}",6,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])L"{var:}",0x1aa);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{v:0}";
  local_38 = 5;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v:0}",5,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"{v:0}",0x1ae);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{va:0}";
  local_38 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va:0}",6,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])L"{va:0}",0x1b2);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0{var:0}";
  local_38 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0{var:0}",0xd,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"{var:0A",0x1b8);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"var:0{var:0}";
  local_38 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:0{var:0}",0xc,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])0x13a16e,0x1bc);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"var:0}{var:0}";
  local_38 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:0}{var:0}",0xd,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"var:0}A",0x1c0);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0{var:0}{var:0}";
  local_38 = 0x14;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0{var:0}{var:0}",0x14,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,&local_88,(char16_t (*) [9])L"{var:0AA",0x1c4);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:1{var:0}";
  local_38 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1{var:0}",0xd,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"{var:1A",0x1ca);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"var:1{var:0}";
  local_38 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:1{var:0}",0xc,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])0x13a1e6,0x1ce);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"var:1}{var:0}";
  local_38 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:1}{var:0}",0xd,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"var:1}A",0x1d2);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:1{var:0}{var:0}";
  local_38 = 0x14;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1{var:0}{var:0}",0x14,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,&local_88,(char16_t (*) [9])L"{var:1AA",0x1d6);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{{var:0}";
  local_38 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{{var:0}",8,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"{A",0x1dc);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{{var:0}{var:0}";
  local_38 = 0xf;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{{var:0}{var:0}",0xf,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"{AA",0x1e0);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{v{var:0}";
  local_38 = 9;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v{var:0}",9,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"{vA",0x1e4);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{v{var:0}{var:0}";
  local_38 = 0x10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v{var:0}{var:0}",0x10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])L"{vAA",0x1e8);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{va{var:0}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va{var:0}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])L"{vaA",0x1ec);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{va{var:0}{var:0}";
  local_38 = 0x11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va{var:0}{var:0}",0x11,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"{vaAA",0x1f0);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var{var:0}";
  local_38 = 0xb;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var{var:0}",0xb,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"{varA",500);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var{var:0}{var:0}";
  local_38 = 0x12;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var{var:0}{var:0}",0x12,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])L"{varAA",0x1f8);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{-{var:0}";
  local_38 = 9;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{-{var:0}",9,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"{-A",0x1fe);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{-{var:0}{var:0}";
  local_38 = 0x10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{-{var:0}{var:0}",0x10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])L"{-AA",0x202);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{v-{var:0}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v-{var:0}",10,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])L"{v-A",0x206);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{v-{var:0}{var:0}";
  local_38 = 0x11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v-{var:0}{var:0}",0x11,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"{v-AA",0x20a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{va-{var:0}";
  local_38 = 0xb;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va-{var:0}",0xb,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"{va-A",0x20e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{va-{var:0}{var:0}";
  local_38 = 0x12;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va-{var:0}{var:0}",0x12,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])L"{va-AA",0x212);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var-{var:0}";
  local_38 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var-{var:0}",0xc,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])L"{var-A",0x216);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var-{var:0}{var:0}";
  local_38 = 0x13;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var-{var:0}{var:0}",0x13,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"{var-AA",0x21a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var-0}";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var-0}",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])0x13a4c2,0x220);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var 0}";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var 0}",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])0x13a4d4,0x224);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0 }";
  local_38 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0 }",8,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,&local_88,(char16_t (*) [9])0x13a4e6,0x228);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0 ";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0 ",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])0x13a4fa,0x22c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{var:0";
  local_38 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0",6,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])0x13a50c,0x230);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L" {var-0}";
  local_38 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var-0}",8,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,&local_88,(char16_t (*) [9])L" {var-0}",0x234);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L" {var 0}";
  local_38 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var 0}",8,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,&local_88,(char16_t (*) [9])L" {var 0}",0x238);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L" {var:0 }";
  local_38 = 9;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var:0 }",9,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[10]>
            (test,&local_88,(char16_t (*) [10])L" {var:0 }",0x23c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L" {var:0 ";
  local_38 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var:0 ",8,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,&local_88,(char16_t (*) [9])L" {var:0 ",0x240);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L" {var:0";
  local_38 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var:0",7,&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,&local_98,(Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L" {var:0",0x244);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  pcVar2 = local_88.storage_;
  if (local_88.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

static void TestVariableUTag3(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;
    const char16_t        *content;

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({var:a})", value, ss), uR"({var:a})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[a]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[abc]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[abc]})", __LINE__);
    ss.Clear();

    ////////////////

    value = JSON::Parse(uR"([[[]],{"a":["x"],"b":{"a":"X"}}])");

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0][0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0][0]})", __LINE__);
    ss.Clear();

    /////

    content = uR"({var:1})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1})", __LINE__);
    ss.Clear();

    content = uR"({var:2})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:2})", __LINE__);
    ss.Clear();

    content = uR"({var:1[a]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:1[b]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[b]})", __LINE__);
    ss.Clear();

    ////

    value = JSON::Parse(uR"(["A", "abc", true, 456, 1.5])");

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"(var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0})", __LINE__);
    ss.Clear();

    content = uR"({v})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v})", __LINE__);
    ss.Clear();

    content = uR"({va})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va})", __LINE__);
    ss.Clear();

    content = uR"({var})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var})", __LINE__);
    ss.Clear();

    content = uR"({var:})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:})", __LINE__);
    ss.Clear();

    content = uR"({v:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v:0})", __LINE__);
    ss.Clear();

    content = uR"({va:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va:0})", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0}A)", __LINE__);
    ss.Clear();

    content = uR"({var:0{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1}A)", __LINE__);
    ss.Clear();

    content = uR"({var:1{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({A)", __LINE__);
    ss.Clear();

    content = uR"({{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({AA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vAA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaAA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varAA)", __LINE__);
    ss.Clear();

    ///

    content = uR"({-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-A)", __LINE__);
    ss.Clear();

    content = uR"({-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-AA)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-A)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-AA)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-A)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-AA)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-A)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-AA)", __LINE__);
    ss.Clear();

    //

    content = uR"({var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-0})", __LINE__);
    ss.Clear();

    content = uR"({var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var 0})", __LINE__);
    ss.Clear();

    content = uR"({var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 })", __LINE__);
    ss.Clear();

    content = uR"({var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 )", __LINE__);
    ss.Clear();

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"( {var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var-0})", __LINE__);
    ss.Clear();

    content = uR"( {var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var 0})", __LINE__);
    ss.Clear();

    content = uR"( {var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 })", __LINE__);
    ss.Clear();

    content = uR"( {var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 )", __LINE__);
    ss.Clear();

    content = uR"( {var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0)", __LINE__);
    ss.Clear();
}